

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int parse_asn1_tag(CBS *cbs,CBS_ASN1_TAG *out)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  uint64_t in_RAX;
  byte *in_RCX;
  byte bVar5;
  uint64_t v;
  uint64_t local_28;
  
  sVar2 = cbs->len;
  if (sVar2 != 0) {
    in_RCX = cbs->data;
    cbs->data = in_RCX + 1;
    cbs->len = sVar2 - 1;
  }
  iVar4 = 0;
  if (sVar2 != 0) {
    bVar1 = *in_RCX;
    uVar3 = bVar1 & 0x1f;
    if (uVar3 == 0x1f) {
      local_28 = in_RAX;
      iVar4 = parse_base128_integer(cbs,&local_28);
      bVar5 = local_28 - 0x1f < 0x1fffffe1 & (byte)iVar4;
      uVar3 = 0x1f;
      if (bVar5 != 0) {
        uVar3 = (uint)local_28;
      }
      if (bVar5 != 1) {
        return 0;
      }
    }
    uVar3 = (bVar1 & 0xffffffe0) << 0x18 | uVar3;
    iVar4 = 0;
    if ((uVar3 & 0xdfffffff) != 0) {
      *out = uVar3;
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

static int parse_asn1_tag(CBS *cbs, CBS_ASN1_TAG *out) {
  uint8_t tag_byte;
  if (!CBS_get_u8(cbs, &tag_byte)) {
    return 0;
  }

  // ITU-T X.690 section 8.1.2.3 specifies the format for identifiers with a tag
  // number no greater than 30.
  //
  // If the number portion is 31 (0x1f, the largest value that fits in the
  // allotted bits), then the tag is more than one byte long and the
  // continuation bytes contain the tag number.
  CBS_ASN1_TAG tag = ((CBS_ASN1_TAG)tag_byte & 0xe0) << CBS_ASN1_TAG_SHIFT;
  CBS_ASN1_TAG tag_number = tag_byte & 0x1f;
  if (tag_number == 0x1f) {
    uint64_t v;
    if (!parse_base128_integer(cbs, &v) ||
        // Check the tag number is within our supported bounds.
        v > CBS_ASN1_TAG_NUMBER_MASK ||
        // Small tag numbers should have used low tag number form, even in BER.
        v < 0x1f) {
      return 0;
    }
    tag_number = (CBS_ASN1_TAG)v;
  }

  tag |= tag_number;

  // Tag [UNIVERSAL 0] is reserved for use by the encoding. Reject it here to
  // avoid some ambiguity around ANY values and BER indefinite-length EOCs. See
  // https://crbug.com/boringssl/455.
  if ((tag & ~CBS_ASN1_CONSTRUCTED) == 0) {
    return 0;
  }

  *out = tag;
  return 1;
}